

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createBuiltinCall
          (Builder *this,Id resultType,Id builtins,int entryPoint,Vector<Id> *args)

{
  Block *this_00;
  int iVar1;
  Id IVar2;
  Instruction *pIVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48;
  int local_40;
  int arg;
  Instruction *local_30;
  Instruction *inst;
  Vector<Id> *args_local;
  Id local_18;
  int entryPoint_local;
  Id builtins_local;
  Id resultType_local;
  Builder *this_local;
  
  inst = (Instruction *)args;
  args_local._4_4_ = entryPoint;
  local_18 = builtins;
  entryPoint_local = resultType;
  _builtins_local = this;
  pIVar3 = (Instruction *)
           Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,resultType));
  IVar2 = getUniqueId(this);
  Instruction::Instruction(pIVar3,IVar2,entryPoint_local,OpExtInst);
  local_30 = pIVar3;
  Instruction::addIdOperand(pIVar3,local_18);
  Instruction::addImmediateOperand(local_30,args_local._4_4_);
  local_40 = 0;
  while( true ) {
    iVar1 = local_40;
    sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)inst);
    pIVar3 = local_30;
    if ((int)sVar4 <= iVar1) break;
    pvVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)inst,
                        (long)local_40);
    Instruction::addIdOperand(pIVar3,*pvVar5);
    local_40 = local_40 + 1;
  }
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_48,
             local_30);
  Block::addInstruction(this_00,&local_48);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_48);
  IVar2 = Instruction::getResultId(local_30);
  return IVar2;
}

Assistant:

Id Builder::createBuiltinCall(Id resultType, Id builtins, int entryPoint, const dxil_spv::Vector<Id>& args)
{
    Instruction* inst = new Instruction(getUniqueId(), resultType, OpExtInst);
    inst->addIdOperand(builtins);
    inst->addImmediateOperand(entryPoint);
    for (int arg = 0; arg < (int)args.size(); ++arg)
        inst->addIdOperand(args[arg]);

    buildPoint->addInstruction(std::unique_ptr<Instruction>(inst));

    return inst->getResultId();
}